

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O3

void bench_ecmult_1p_g(void *arg,int iters)

{
  uint uVar1;
  ulong uVar2;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_860;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  if (1 < iters) {
    uVar2 = 0;
    do {
      uVar1 = *(int *)((long)arg + 0x50) + (int)uVar2 & 0x7fff;
      local_860.aux = local_848;
      local_860.pre_a = local_708;
      local_860.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf
                (&local_860,(secp256k1_gej *)(uVar2 * 0x80 + *(long *)((long)arg + 0x60)),1,
                 (secp256k1_gej *)((ulong)(uVar1 << 7) + *(long *)((long)arg + 0x20)),
                 (secp256k1_scalar *)
                 ((ulong)((*(int *)((long)arg + 0x58) + (int)uVar2 & 0x7fffU) << 5) +
                 *(long *)((long)arg + 0x10)),
                 (secp256k1_scalar *)((ulong)(uVar1 << 5) + *(long *)((long)arg + 0x10)));
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)iters >> 1);
  }
  return;
}

Assistant:

static void bench_ecmult_1p_g(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int i;

    for (i = 0; i < iters/2; ++i) {
        secp256k1_ecmult(&data->output[i], &data->pubkeys_gej[(data->offset1+i) % POINTS], &data->scalars[(data->offset2+i) % POINTS], &data->scalars[(data->offset1+i) % POINTS]);
    }
}